

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void Catch::prepareExpandedExpression(AssertionResult *result)

{
  AssertionResult *in_stack_00000018;
  string asStack_28 [40];
  
  AssertionResult::getExpandedExpression_abi_cxx11_(in_stack_00000018);
  std::__cxx11::string::~string(asStack_28);
  return;
}

Assistant:

void prepareExpandedExpression(AssertionResult& result) {
        result.getExpandedExpression();
    }